

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::SentencePieceText::MergeFrom(SentencePieceText *this,SentencePieceText *from)

{
  uint uVar1;
  SentencePieceText *this_00;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *this_01;
  long in_RSI;
  long in_RDI;
  uint32 cached_has_bits;
  SentencePieceText *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff18;
  SentencePieceText *in_stack_ffffffffffffff20;
  ExtensionSet *in_stack_ffffffffffffff58;
  ExtensionSet *in_stack_ffffffffffffff60;
  
  google::protobuf::internal::ExtensionSet::MergeFrom
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_01 = (RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *)(in_RDI + 8);
  this_00 = (SentencePieceText *)(in_RSI + 8);
  if (((uint)(this_00->super_MessageLite)._vptr_MessageLite & 1) == 1) {
    if (((uint)(this_00->super_MessageLite)._vptr_MessageLite & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                ((InternalMetadata *)this_00);
      in_stack_ffffffffffffff08 = this_00;
    }
    else {
      (*(code *)0x0)();
      in_stack_ffffffffffffff08 = this_00;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              ((InternalMetadata *)this_01,(string *)in_stack_ffffffffffffff08);
  }
  google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::MergeFrom
            (this_01,(RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *)
                     in_stack_ffffffffffffff08);
  uVar1 = *(uint *)(in_RSI + 0x28);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_text_abi_cxx11_(in_stack_ffffffffffffff08);
      _internal_set_text(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RSI + 0x50);
    }
    *(uint *)(in_RDI + 0x28) = uVar1 | *(uint *)(in_RDI + 0x28);
  }
  return;
}

Assistant:

void SentencePieceText::MergeFrom(const SentencePieceText& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.SentencePieceText)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pieces_.MergeFrom(from.pieces_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_text(from._internal_text());
    }
    if (cached_has_bits & 0x00000002u) {
      score_ = from.score_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}